

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS
ref_layer_align_quad_advance
          (REF_GRID ref_grid,REF_CLOUD last,REF_LIST last_list,REF_CLOUD next,REF_LIST next_list)

{
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  REF_GEOM ref_geom;
  REF_GRID ref_grid_00;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  REF_INT node;
  REF_INT new_node;
  REF_INT id;
  REF_CAVITY ref_cavity;
  REF_DBL xyz [3];
  REF_DBL normal [3];
  REF_INT closest_node;
  REF_DBL dist;
  REF_DBL d [12];
  REF_DBL uv [2];
  REF_DBL m [6];
  REF_INT local_17c;
  int local_178;
  REF_INT local_174;
  REF_CAVITY local_170;
  REF_NODE local_168;
  REF_GLOB local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_138 [3];
  long local_120;
  REF_LIST local_118;
  REF_CLOUD local_110;
  REF_GEOM local_108;
  REF_GRID local_100;
  REF_CLOUD local_f8;
  REF_LIST local_f0;
  REF_INT local_e4;
  REF_DBL local_e0;
  double local_d8 [3];
  double local_c0;
  double local_b8;
  double local_b0;
  REF_DBL local_78 [2];
  REF_DBL local_68 [7];
  
  if (last->n < 1) {
LAB_001ea469:
    RVar7 = 0;
  }
  else {
    pRVar1 = ref_grid->node;
    local_108 = ref_grid->geom;
    local_160 = *last->global;
    local_f0 = last_list;
    uVar3 = ref_node_local(pRVar1,local_160,&local_17c);
    if (uVar3 == 0) {
      lVar10 = 0;
      lVar11 = 0;
      local_168 = pRVar1;
      local_118 = next_list;
      local_110 = next;
      local_100 = ref_grid;
      local_f8 = last;
      do {
        lVar4 = (long)last->naux;
        if (0 < lVar4) {
          pRVar2 = last->aux;
          lVar6 = 0;
          do {
            local_138[lVar6] = *(double *)((long)pRVar2 + lVar6 * 8 + lVar10 * lVar4);
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
        uVar3 = ref_node_metric_get(local_168,local_17c,local_68);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "get";
          uVar5 = 0x270;
          goto LAB_001ea063;
        }
        uVar3 = ref_matrix_diag_m(local_68,local_d8);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "eigen decomp";
          uVar5 = 0x271;
          goto LAB_001ea063;
        }
        uVar3 = ref_matrix_descending_eig_twod(local_d8);
        if (uVar3 != 0) {
          uVar8 = (ulong)uVar3;
          pcVar9 = "2D eig sort";
          uVar5 = 0x272;
          goto LAB_001ea063;
        }
        dVar12 = local_138[2] * local_b0 + local_138[0] * local_c0 + local_138[1] * local_b8;
        if (dVar12 <= -dVar12) {
          dVar12 = -dVar12;
        }
        if (0.9848 < dVar12) {
          if (local_d8[0] < 0.0) {
            dVar12 = sqrt(local_d8[0]);
          }
          else {
            dVar12 = SQRT(local_d8[0]);
          }
          pRVar1 = local_168;
          dVar12 = 1.0 / dVar12;
          pRVar2 = local_168->real;
          lVar4 = (long)local_17c;
          local_158 = local_138[0] * dVar12 + pRVar2[lVar4 * 0xf];
          local_150 = local_138[1] * dVar12 + pRVar2[lVar4 * 0xf + 1];
          local_148 = dVar12 * local_138[2] + pRVar2[lVar4 * 0xf + 2];
          uVar3 = ref_node_nearest_xyz(local_168,&local_158,&local_e4,&local_e0);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "close";
            uVar5 = 0x27f;
            goto LAB_001ea063;
          }
          uVar3 = ref_node_next_global(pRVar1,&local_160);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "global";
            uVar5 = 0x280;
            goto LAB_001ea063;
          }
          uVar3 = ref_cloud_store(local_110,local_160,local_138);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "store cloud";
            uVar5 = 0x281;
            goto LAB_001ea063;
          }
          uVar3 = ref_list_push(local_118,local_17c);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "store list";
            uVar5 = 0x282;
            goto LAB_001ea063;
          }
          uVar3 = ref_node_add(pRVar1,local_160,&local_178);
          ref_grid_00 = local_100;
          ref_geom = local_108;
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "add";
            uVar5 = 0x283;
            goto LAB_001ea063;
          }
          pRVar2 = pRVar1->real;
          lVar4 = (long)local_178;
          pRVar2[lVar4 * 0xf] = local_158;
          pRVar2[lVar4 * 0xf + 1] = local_150;
          pRVar2[lVar4 * 0xf + 2] = local_148;
          local_120 = lVar10;
          uVar3 = ref_geom_unique_id(local_108,local_17c,2,&local_174);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "unique face id";
            uVar5 = 0x288;
            goto LAB_001ea063;
          }
          uVar3 = ref_geom_tuv(ref_geom,local_17c,2,local_174,local_78);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "uv";
            uVar5 = 0x289;
            goto LAB_001ea063;
          }
          uVar3 = ref_egads_inverse_eval(ref_geom,2,local_174,&local_158,local_78);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "inverse uv";
            uVar5 = 0x28a;
            goto LAB_001ea063;
          }
          uVar3 = ref_geom_add(ref_geom,local_178,2,local_174,local_78);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "new geom";
            uVar5 = 0x28b;
            goto LAB_001ea063;
          }
          uVar3 = ref_metric_interpolate_between(ref_grid_00,local_17c,-1,local_178);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "metric interp";
            uVar5 = 0x28d;
            goto LAB_001ea063;
          }
          uVar3 = ref_cavity_create(&local_170);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "cav create";
            uVar5 = 0x28e;
            goto LAB_001ea063;
          }
          uVar3 = ref_cavity_form_insert
                            (local_170,ref_grid_00,local_178,local_17c,local_f0->value[lVar11],-1);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "ball";
            uVar5 = 0x291;
            goto LAB_001ea063;
          }
          uVar3 = ref_cavity_enlarge_conforming(local_170);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x295,"ref_layer_align_quad_advance",(ulong)uVar3,"enlarge");
            ref_cavity_tec(local_170,"cav-fail.tec");
            ref_export_by_extension(ref_grid_00,"mesh-fail.tec");
            return uVar3;
          }
          if (local_170->state == REF_CAVITY_VISIBLE) {
            uVar3 = ref_cavity_replace(local_170);
            lVar10 = local_120;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x29d,"ref_layer_align_quad_advance",(ulong)uVar3,"cav replace");
              ref_cavity_tec(local_170,"ref_layer_align_quad_cavity.tec");
              ref_export_by_extension(ref_grid_00,"ref_layer_align_quad_mesh.tec");
              printf("norm %f %f %f dir %f %f %f dot %f\n");
              printf("new %f %f %f\n",local_158,local_150,local_148);
              return uVar3;
            }
          }
          else {
            uVar3 = ref_node_remove(pRVar1,local_178);
            lVar10 = local_120;
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar9 = "rm";
              uVar5 = 0x29f;
              goto LAB_001ea063;
            }
            uVar3 = ref_geom_remove_all(local_108,local_178);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar9 = "rm";
              uVar5 = 0x2a0;
              goto LAB_001ea063;
            }
            local_110->n = local_110->n + -1;
            local_118->n = local_118->n + -1;
          }
          uVar3 = ref_cavity_free(local_170);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "cav free";
            uVar5 = 0x2a4;
            goto LAB_001ea063;
          }
        }
        last = local_f8;
        lVar11 = lVar11 + 1;
        if (local_f8->n <= lVar11) goto LAB_001ea469;
        local_160 = local_f8->global[lVar11];
        uVar3 = ref_node_local(local_168,local_160,&local_17c);
        lVar10 = lVar10 + 8;
      } while (uVar3 == 0);
    }
    uVar8 = (ulong)uVar3;
    pcVar9 = "local";
    uVar5 = 0x26c;
LAB_001ea063:
    RVar7 = (REF_STATUS)uVar8;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar5,
           "ref_layer_align_quad_advance",uVar8,pcVar9);
  }
  return RVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_align_quad_advance(REF_GRID ref_grid,
                                                       REF_CLOUD last,
                                                       REF_LIST last_list,
                                                       REF_CLOUD next,
                                                       REF_LIST next_list) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node, item;
  REF_GLOB global;

  each_ref_cloud_global(last, item, global) {
    REF_DBL normal[3];

    REF_DBL d[12], m[6];
    REF_DBL dot;
    REF_INT aux_index;
    RSS(ref_node_local(ref_node, global, &node), "local");
    each_ref_cloud_aux(last, aux_index) {
      normal[aux_index] = ref_cloud_aux(last, aux_index, item);
    }
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_matrix_diag_m(m, d), "eigen decomp");
    RSS(ref_matrix_descending_eig_twod(d), "2D eig sort");
    dot = ref_math_dot(normal, &(d[3]));
    if (ABS(dot) > 0.9848) { /* cos(10 degrees) */
      REF_DBL h, xyz[3], dist;
      REF_INT closest_node;
      REF_INT new_node;
      REF_INT type, id;
      REF_DBL uv[2];
      REF_CAVITY ref_cavity;
      h = 1.0 / sqrt(d[0]);
      xyz[0] = ref_node_xyz(ref_node, 0, node) + h * normal[0];
      xyz[1] = ref_node_xyz(ref_node, 1, node) + h * normal[1];
      xyz[2] = ref_node_xyz(ref_node, 2, node) + h * normal[2];
      RSS(ref_node_nearest_xyz(ref_node, xyz, &closest_node, &dist), "close");
      RSS(ref_node_next_global(ref_node, &global), "global");
      RSS(ref_cloud_store(next, global, normal), "store cloud");
      RSS(ref_list_push(next_list, node), "store list");
      RSS(ref_node_add(ref_node, global, &new_node), "add");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2];
      type = REF_GEOM_FACE;
      RSS(ref_geom_unique_id(ref_geom, node, type, &id), "unique face id");
      RSS(ref_geom_tuv(ref_geom, node, type, id, uv), "uv");
      RSS(ref_egads_inverse_eval(ref_geom, type, id, xyz, uv), "inverse uv");
      RSS(ref_geom_add(ref_geom, new_node, type, id, uv), "new geom");
      RSS(ref_metric_interpolate_between(ref_grid, node, REF_EMPTY, new_node),
          "metric interp");
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_insert(ref_cavity, ref_grid, new_node, node,
                                 ref_list_value(last_list, item), REF_EMPTY),
          "ball");
      RSB(ref_cavity_enlarge_conforming(ref_cavity), "enlarge", {
        ref_cavity_tec(ref_cavity, "cav-fail.tec");
        ref_export_by_extension(ref_grid, "mesh-fail.tec");
      });
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        RSB(ref_cavity_replace(ref_cavity), "cav replace", {
          ref_cavity_tec(ref_cavity, "ref_layer_align_quad_cavity.tec");
          ref_export_by_extension(ref_grid, "ref_layer_align_quad_mesh.tec");
          printf("norm %f %f %f dir %f %f %f dot %f\n", normal[0], normal[1],
                 normal[2], d[3], d[4], d[5], ref_math_dot(normal, &(d[3])));
          printf("new %f %f %f\n", xyz[0], xyz[1], xyz[2]);
        });
      } else {
        RSS(ref_node_remove(ref_node, new_node), "rm");
        RSS(ref_geom_remove_all(ref_geom, new_node), "rm");
        ref_cloud_n(next)--;
        ref_list_n(next_list)--;
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  return REF_SUCCESS;
}